

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspConfig::ClaspConfig(ClaspConfig *this)

{
  Impl *this_00;
  undefined8 *in_RDI;
  BasicSatConfig *in_stack_00000090;
  SolveOptions *in_stack_ffffffffffffffd0;
  
  BasicSatConfig::BasicSatConfig(in_stack_00000090);
  *in_RDI = &PTR__ClaspConfig_002dc050;
  SolveOptions::SolveOptions(in_stack_ffffffffffffffd0);
  Asp::LogicProgram::AspOptions::AspOptions((AspOptions *)in_stack_ffffffffffffffd0);
  ParserOptions::ParserOptions((ParserOptions *)(in_RDI + 0x17));
  in_RDI[0x18] = 0;
  this_00 = (Impl *)operator_new(0x40);
  Impl::Impl(this_00);
  in_RDI[0x19] = this_00;
  return;
}

Assistant:

ClaspConfig::ClaspConfig() : tester_(0), impl_(new Impl()) {}